

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZXBigInteger.h
# Opt level: O3

BigInteger * __thiscall ZXing::BigInteger::operator+=(BigInteger *this,BigInteger *a)

{
  if ((this->mag).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->mag).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    this->negative = a->negative;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign(&this->mag,&a->mag);
  }
  else {
    Add(this,a,this);
  }
  return this;
}

Assistant:

BigInteger& operator+=(BigInteger&& a) {
		if (mag.empty())
			*this = std::move(a);
		else
			Add(*this, a, *this);
		return *this;
	}